

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool testing::internal::InDeathTestChild(void)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
  bVar1 = g_in_fast_death_test_child;
  if (iVar2 == 0) {
    bVar1 = DAT_001a1a90 != 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool InDeathTestChild() {
# if GTEST_OS_WINDOWS

  // On Windows, death tests are thread-safe regardless of the value of the
  // death_test_style flag.
  return !GTEST_FLAG(internal_run_death_test).empty();

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe")
    return !GTEST_FLAG(internal_run_death_test).empty();
  else
    return g_in_fast_death_test_child;
#endif
}